

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_asm.cpp
# Opt level: O3

void assessQpPrimalFeasibility
               (Instance *instance,double primal_feasibility_tolerance,
               vector<double,_std::allocator<double>_> *var_value,
               vector<double,_std::allocator<double>_> *con_value,HighsInt *num_var_infeasibilities,
               double *max_var_infeasibility,double *sum_var_infeasibilities,
               HighsInt *num_con_infeasibilities,double *max_con_infeasibility,
               double *sum_con_infeasibilities,double *max_con_residual,double *sum_con_residuals)

{
  int iVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer piVar5;
  pointer piVar6;
  pointer pdVar7;
  int iVar8;
  double *pdVar9;
  long lVar10;
  long lVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> local_68;
  value_type local_48;
  
  *num_var_infeasibilities = 0;
  *max_var_infeasibility = 0.0;
  *sum_var_infeasibilities = 0.0;
  *num_con_infeasibilities = 0;
  *max_con_infeasibility = 0.0;
  *sum_con_infeasibilities = 0.0;
  *max_con_residual = 0.0;
  *sum_con_residuals = 0.0;
  local_68.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.hi = 0.0;
  local_48.lo = 0.0;
  std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::_M_fill_assign
            (&local_68,(long)instance->num_con,&local_48);
  if (0 < instance->num_var) {
    pdVar2 = (instance->var_lo).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (instance->var_up).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (var_value->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar5 = (instance->A).mat.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (instance->A).mat.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (instance->A).mat.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar10 = 0;
    do {
      dVar12 = pdVar2[lVar10];
      dVar14 = pdVar4[lVar10];
      if (dVar12 - primal_feasibility_tolerance <= dVar14) {
        dVar12 = pdVar3[lVar10];
        if (dVar12 + primal_feasibility_tolerance < dVar14) {
          dVar12 = dVar14 - dVar12;
          goto LAB_0032ccc1;
        }
      }
      else {
        dVar12 = dVar12 - dVar14;
LAB_0032ccc1:
        if (0.0 < dVar12) {
          if (primal_feasibility_tolerance < dVar12) {
            *num_var_infeasibilities = *num_var_infeasibilities + 1;
          }
          dVar13 = *max_var_infeasibility;
          if (*max_var_infeasibility <= dVar12) {
            dVar13 = dVar12;
          }
          *max_var_infeasibility = dVar13;
          *sum_var_infeasibilities = dVar12 + *sum_var_infeasibilities;
        }
      }
      iVar8 = piVar5[lVar10];
      lVar11 = (long)iVar8;
      iVar1 = piVar5[lVar10 + 1];
      if (iVar8 < iVar1) {
        do {
          dVar13 = pdVar7[lVar11] * dVar14;
          iVar8 = piVar6[lVar11];
          dVar12 = local_68.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar8].hi;
          dVar15 = dVar13 + dVar12;
          local_68.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
          super__Vector_impl_data._M_start[iVar8].hi = dVar15;
          local_68.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
          super__Vector_impl_data._M_start[iVar8].lo =
               (dVar12 - (dVar15 - dVar13)) + (dVar13 - (dVar15 - (dVar15 - dVar13))) +
               local_68.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
               super__Vector_impl_data._M_start[iVar8].lo;
          lVar11 = lVar11 + 1;
        } while (iVar1 != lVar11);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < instance->num_var);
  }
  iVar8 = instance->num_con;
  if (iVar8 < 1) {
    if (local_68.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      return;
    }
  }
  else {
    pdVar2 = (instance->con_lo).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (instance->con_up).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (con_value->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar9 = &(local_68.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
               super__Vector_impl_data._M_start)->lo;
    lVar10 = 0;
    do {
      dVar12 = pdVar2[lVar10];
      dVar14 = pdVar4[lVar10];
      if (dVar12 - primal_feasibility_tolerance <= dVar14) {
        dVar12 = pdVar3[lVar10];
        if (dVar12 + primal_feasibility_tolerance < dVar14) {
          dVar12 = dVar14 - dVar12;
          goto LAB_0032cdf1;
        }
      }
      else {
        dVar12 = dVar12 - dVar14;
LAB_0032cdf1:
        if (0.0 < dVar12) {
          if (primal_feasibility_tolerance < dVar12) {
            *num_con_infeasibilities = *num_con_infeasibilities + 1;
            iVar8 = instance->num_con;
          }
          dVar13 = *max_con_infeasibility;
          if (*max_con_infeasibility <= dVar12) {
            dVar13 = dVar12;
          }
          *max_con_infeasibility = dVar13;
          *sum_con_infeasibilities = dVar12 + *sum_con_infeasibilities;
        }
      }
      dVar14 = ABS(dVar14 - (((HighsCDouble *)(pdVar9 + -1))->hi + *pdVar9));
      dVar12 = *max_con_residual;
      if (*max_con_residual <= dVar14) {
        dVar12 = dVar14;
      }
      *max_con_residual = dVar12;
      *sum_con_residuals = *sum_con_residuals + dVar14;
      lVar10 = lVar10 + 1;
      pdVar9 = pdVar9 + 2;
    } while (lVar10 < iVar8);
  }
  operator_delete(local_68.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                  super__Vector_impl_data._M_start);
  return;
}

Assistant:

void assessQpPrimalFeasibility(
    const Instance& instance, const double primal_feasibility_tolerance,
    const std::vector<double>& var_value, const std::vector<double>& con_value,
    HighsInt& num_var_infeasibilities, double& max_var_infeasibility,
    double& sum_var_infeasibilities, HighsInt& num_con_infeasibilities,
    double& max_con_infeasibility, double& sum_con_infeasibilities,
    double& max_con_residual, double& sum_con_residuals) {
  num_var_infeasibilities = 0;
  max_var_infeasibility = 0;
  sum_var_infeasibilities = 0;
  num_con_infeasibilities = 0;
  max_con_infeasibility = 0;
  sum_con_infeasibilities = 0;
  max_con_residual = 0;
  sum_con_residuals = 0;
  // Valid solution, but is it feasible?
  std::vector<HighsCDouble> con_value_quad;
  con_value_quad.assign(instance.num_con, HighsCDouble{0.0});
  for (HighsInt iVar = 0; iVar < instance.num_var; iVar++) {
    double lower = instance.var_lo[iVar];
    double upper = instance.var_up[iVar];
    double primal = var_value[iVar];
    double var_infeasibility = 0;
    if (primal < lower - primal_feasibility_tolerance) {
      var_infeasibility = lower - primal;
    } else if (primal > upper + primal_feasibility_tolerance) {
      var_infeasibility = primal - upper;
    }
    if (var_infeasibility > 0) {
      if (var_infeasibility > primal_feasibility_tolerance)
        num_var_infeasibilities++;
      max_var_infeasibility =
          std::max(var_infeasibility, max_var_infeasibility);
      sum_var_infeasibilities += var_infeasibility;
    }
    for (HighsInt iEl = instance.A.mat.start[iVar];
         iEl < instance.A.mat.start[iVar + 1]; iEl++) {
      con_value_quad[instance.A.mat.index[iEl]] +=
          primal * instance.A.mat.value[iEl];
    }
  }
  for (HighsInt iCon = 0; iCon < instance.num_con; iCon++) {
    double lower = instance.con_lo[iCon];
    double upper = instance.con_up[iCon];
    double primal = con_value[iCon];
    double con_infeasibility = 0;
    if (primal < lower - primal_feasibility_tolerance) {
      con_infeasibility = lower - primal;
    } else if (primal > upper + primal_feasibility_tolerance) {
      con_infeasibility = primal - upper;
    }
    if (con_infeasibility > 0) {
      if (con_infeasibility > primal_feasibility_tolerance)
        num_con_infeasibilities++;
      max_con_infeasibility =
          std::max(con_infeasibility, max_con_infeasibility);
      sum_con_infeasibilities += con_infeasibility;
    }
    double con_residual = std::fabs(primal - double(con_value_quad[iCon]));
    max_con_residual = std::max(con_residual, max_con_residual);
    sum_con_residuals += con_residual;
  }
}